

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write_exponent<char,fmt::v7::detail::buffer_appender<char>>
          (int exp,buffer_appender<char> it)

{
  char local_26;
  char local_25;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_21);
      exp = -exp;
    }
    else {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_22);
    }
    if (99 < (uint)exp) {
      if (999 < (uint)exp) {
        buffer<char>::push_back
                  ((buffer<char> *)
                   it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_23
                  );
      }
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_24);
    }
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_25);
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_26);
    return (buffer_appender<char>)
           it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
              ,0x514,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}